

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Pl_PNGFilter.cc
# Opt level: O1

void __thiscall Pl_PNGFilter::decodeRow(Pl_PNGFilter *this)

{
  uint uVar1;
  uchar *puVar2;
  uchar *puVar3;
  Pipeline *pPVar4;
  ulong uVar5;
  uchar uVar6;
  
  puVar2 = this->prev_row;
  if (puVar2 != (uchar *)0x0) {
    puVar3 = this->cur_row;
    switch(*puVar3) {
    case '\x01':
      if (this->bytes_per_row != 0) {
        uVar1 = this->bytes_per_pixel;
        uVar5 = 0;
        do {
          if (uVar5 < uVar1) {
            uVar6 = '\0';
          }
          else {
            uVar6 = puVar3[(ulong)((int)uVar5 - uVar1) + 1];
          }
          puVar3[uVar5 + 1] = puVar3[uVar5 + 1] + uVar6;
          uVar5 = uVar5 + 1;
        } while (uVar5 < this->bytes_per_row);
      }
      break;
    case '\x02':
      if (this->bytes_per_row != 0) {
        uVar5 = 0;
        do {
          puVar3[uVar5 + 1] = puVar3[uVar5 + 1] + puVar2[uVar5 + 1];
          uVar5 = uVar5 + 1;
        } while (uVar5 < this->bytes_per_row);
      }
      break;
    case '\x03':
      decodeAverage(this);
      break;
    case '\x04':
      decodePaeth(this);
    }
  }
  pPVar4 = (this->super_Pipeline).next_;
  (*pPVar4->_vptr_Pipeline[2])(pPVar4,this->cur_row + 1,(ulong)this->bytes_per_row);
  return;
}

Assistant:

void
Pl_PNGFilter::decodeRow()
{
    int filter = this->cur_row[0];
    if (this->prev_row) {
        switch (filter) {
        case 0:
            break;
        case 1:
            this->decodeSub();
            break;
        case 2:
            this->decodeUp();
            break;
        case 3:
            this->decodeAverage();
            break;
        case 4:
            this->decodePaeth();
            break;
        default:
            // ignore
            break;
        }
    }

    next()->write(this->cur_row + 1, this->bytes_per_row);
}